

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  undefined7 extraout_var;
  byte bVar4;
  char *pcVar5;
  pair<bool,_const_char_*> pVar6;
  
  uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (lhs == (char *)0x0 && rhs == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = rhs;
    if ((lhs != (char *)0x0) && (pcVar5 = lhs, rhs != (char *)0x0)) {
      if (t - NumberMinType < 2) {
        pVar6 = consistentNumberProperty(lhs,rhs,t);
        return pVar6;
      }
      if (t == StringType) {
        pVar6 = consistentStringProperty(lhs,rhs);
        return pVar6;
      }
      if (t != BoolType) {
        __assert_fail("false && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                      ,0x11ba,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      bVar1 = cmSystemTools::IsOn(lhs);
      bVar2 = cmSystemTools::IsOn(rhs);
      uVar3 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
      bVar4 = (byte)uVar3 ^ bVar1;
      uVar3 = CONCAT71((int7)(uVar3 >> 8),bVar4) ^ 1;
      pcVar5 = (char *)0x0;
      if (bVar4 == 0) {
        pcVar5 = lhs;
      }
    }
  }
  pVar6.second = pcVar5;
  pVar6._0_8_ = uVar3;
  return pVar6;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return std::make_pair(true, lhs);
  }
  if (!lhs) {
    return std::make_pair(true, rhs);
  }
  if (!rhs) {
    return std::make_pair(true, lhs);
  }

  const char* const null_ptr = nullptr;

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : nullptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}